

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcheckbox.cpp
# Opt level: O2

QSize __thiscall QCheckBox::sizeHint(QCheckBox *this)

{
  long lVar1;
  long lVar2;
  char cVar3;
  QStyle *pQVar4;
  QSize QVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  QArrayDataPointer<char16_t> local_e0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  ulong local_b8;
  QFontMetrics fm;
  QStyleOptionButton opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  if ((*(int *)(lVar2 + 0x2ac) < 0) || (*(int *)(lVar2 + 0x2b0) < 0)) {
    QWidget::ensurePolished((QWidget *)this);
    _fm = &DAT_aaaaaaaaaaaaaaaa;
    QWidget::fontMetrics((QWidget *)&fm);
    opt.icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    opt.iconSize = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    opt.text.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    opt.text.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionButton::QStyleOptionButton(&opt);
    (**(code **)(*(long *)&(this->super_QAbstractButton).super_QWidget + 0x1b8))(this,&opt);
    pQVar4 = QWidget::style((QWidget *)this);
    local_c8 = 0;
    uStack_c0 = 0xffffffffffffffff;
    QAbstractButton::text((QString *)&local_e0,&this->super_QAbstractButton);
    auVar9 = (**(code **)(*(long *)pQVar4 + 0x88))(pQVar4,&fm,&local_c8,0x800,0,&local_e0);
    uVar7 = (auVar9._8_8_ - auVar9._0_8_) + 1;
    uVar8 = ((auVar9._8_8_ >> 0x20) - (auVar9._0_8_ >> 0x20)) + 1;
    local_b8 = uVar7 & 0xffffffff | uVar8 << 0x20;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
    cVar3 = QIcon::isNull();
    if (cVar3 == '\0') {
      uVar6 = (ulong)(uint)opt.iconSize.ht.m_i;
      if (opt.iconSize.ht.m_i < (int)uVar8) {
        uVar6 = uVar8 & 0xffffffff;
      }
      local_b8 = (ulong)(opt.iconSize.wd.m_i + (int)uVar7 + 4) | uVar6 << 0x20;
    }
    pQVar4 = QWidget::style((QWidget *)this);
    QVar5 = (QSize)(**(code **)(*(long *)pQVar4 + 0xe8))(pQVar4,1,&opt,&local_b8,this);
    *(QSize *)(lVar2 + 0x2ac) = QVar5;
    QStyleOptionButton::~QStyleOptionButton(&opt);
    QFontMetrics::~QFontMetrics(&fm);
  }
  else {
    QVar5 = *(QSize *)(lVar2 + 0x2ac);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QSize QCheckBox::sizeHint() const
{
    Q_D(const QCheckBox);
    if (d->sizeHint.isValid())
        return d->sizeHint;
    ensurePolished();
    QFontMetrics fm = fontMetrics();
    QStyleOptionButton opt;
    initStyleOption(&opt);
    QSize sz = style()->itemTextRect(fm, QRect(), Qt::TextShowMnemonic, false,
                                     text()).size();
    if (!opt.icon.isNull())
        sz = QSize(sz.width() + opt.iconSize.width() + 4, qMax(sz.height(), opt.iconSize.height()));
    d->sizeHint = style()->sizeFromContents(QStyle::CT_CheckBox, &opt, sz, this);
    return d->sizeHint;
}